

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::Scrollbar(ImGuiAxis axis)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImGuiWindow *this;
  ImDrawCornerFlags rounding_corners;
  ImGuiID id;
  char *str;
  bool bVar5;
  ImRect bb;
  ImRect local_38;
  
  this = GImGui->CurrentWindow;
  str = "#SCROLLY";
  if (axis == ImGuiAxis_X) {
    str = "#SCROLLX";
  }
  id = ImGuiWindow::GetIDNoKeepAlive(this,str,(char *)0x0);
  KeepAliveID(id);
  local_38 = GetWindowScrollbarRect(this,axis);
  if (axis == ImGuiAxis_X) {
    rounding_corners = (this->ScrollbarY ^ 1) * 8 + 4;
  }
  else {
    bVar5 = (this->Flags & 0x401U) == 1;
    rounding_corners = (uint)bVar5 * 2 + 8;
    if (this->ScrollbarX != false) {
      rounding_corners = (uint)bVar5 * 2;
    }
  }
  if (1 < (uint)axis) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                ,0xe0,"operator[]","ImGui ASSERT FAILED: %s","idx <= 1");
  }
  fVar1 = (&(this->InnerRect).Max.x)[axis];
  if (1 < (uint)axis) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                ,0xe0,"operator[]","ImGui ASSERT FAILED: %s","idx <= 1");
  }
  fVar2 = (&(this->InnerRect).Min.x)[axis];
  if (1 < (uint)axis) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                ,0xe0,"operator[]","ImGui ASSERT FAILED: %s","idx <= 1");
  }
  fVar3 = (&(this->ContentSize).x)[axis];
  if (1 < (uint)axis) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                ,0xe0,"operator[]","ImGui ASSERT FAILED: %s","idx <= 1");
  }
  fVar4 = (&(this->WindowPadding).x)[axis];
  if (1 < (uint)axis) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                ,0xe0,"operator[]","ImGui ASSERT FAILED: %s","idx <= 1");
  }
  ScrollbarEx(&local_38,id,axis,&(this->Scroll).x + axis,fVar1 - fVar2,fVar4 + fVar4 + fVar3,
              rounding_corners);
  return;
}

Assistant:

void ImGui::Scrollbar(ImGuiAxis axis)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiID id = GetWindowScrollbarID(window, axis);
    KeepAliveID(id);

    // Calculate scrollbar bounding box
    ImRect bb = GetWindowScrollbarRect(window, axis);
    ImDrawCornerFlags rounding_corners = 0;
    if (axis == ImGuiAxis_X)
    {
        rounding_corners |= ImDrawCornerFlags_BotLeft;
        if (!window->ScrollbarY)
            rounding_corners |= ImDrawCornerFlags_BotRight;
    }
    else
    {
        if ((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar))
            rounding_corners |= ImDrawCornerFlags_TopRight;
        if (!window->ScrollbarX)
            rounding_corners |= ImDrawCornerFlags_BotRight;
    }
    float size_avail = window->InnerRect.Max[axis] - window->InnerRect.Min[axis];
    float size_contents = window->ContentSize[axis] + window->WindowPadding[axis] * 2.0f;
    ScrollbarEx(bb, id, axis, &window->Scroll[axis], size_avail, size_contents, rounding_corners);
}